

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtaptestlogger.cpp
# Opt level: O2

void __thiscall
QTapTestLogger::addIncident
          (QTapTestLogger *this,IncidentTypes type,char *description,char *file,int line)

{
  long lVar1;
  Data *pDVar2;
  qsizetype qVar3;
  qsizetype qVar4;
  undefined1 *puVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  char16_t *pcVar10;
  QTestCharBuffer *this_00;
  undefined4 in_register_00000084;
  char *pcVar11;
  char *pcVar12;
  char16_t *pcVar13;
  char *pcVar14;
  byte bVar15;
  char16_t *pcVar16;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QLatin1StringView s_03;
  QLatin1StringView s_04;
  QByteArrayView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QAnyStringView QVar23;
  QLatin1StringView key;
  QLatin1StringView key_00;
  QLatin1StringView key_01;
  char *local_5c8;
  QArrayDataPointer<char> local_5a8;
  QArrayDataPointer<char16_t> local_590;
  QStringBuilder<QLatin1String,_QString> local_578;
  QArrayDataPointer<char16_t> local_548;
  undefined1 local_528 [16];
  QArrayDataPointer<char16_t> *local_518;
  QArrayDataPointer<char16_t> local_508;
  anon_class_8_1_a847c8e5 local_4f0;
  QArrayDataPointer<char16_t> local_4e8;
  QArrayDataPointer<char16_t> local_4c8;
  QArrayDataPointer<char16_t> local_4a8;
  QRegularExpressionMatch match;
  QByteArrayView local_488;
  QArrayDataPointer<char16_t> local_478;
  char *description_local;
  QTestCharBuffer message;
  QTestCharBuffer directive;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar12 = (this->m_firstExpectedFail).buf;
  cVar6 = *pcVar12;
  if (cVar6 == '\0' && type < BlacklistedXFail) {
    bVar15 = 0xb3 >> ((byte)type & 0x1f);
  }
  else {
    bVar15 = 0;
  }
  pcVar14 = "SKIP";
  switch(type) {
  case Skip:
    break;
  case Pass:
    pcVar14 = pcVar12;
    if (cVar6 == '\0') goto switchD_00122c25_caseD_3;
    break;
  case XFail:
  case XPass:
  case BlacklistedFail:
  case BlacklistedXPass:
  case BlacklistedXFail:
switchD_00122c25_caseD_2:
    pcVar14 = "TODO";
    break;
  default:
switchD_00122c25_caseD_3:
    pcVar14 = (char *)0x0;
    break;
  case BlacklistedPass:
    pcVar14 = pcVar12;
    if (cVar6 == '\0') goto switchD_00122c25_caseD_2;
  }
  description_local = description;
  memset(&directive,0xaa,0x210);
  directive._size = 0x200;
  directive.buf = directive.staticBuf;
  directive.staticBuf[0] = '\0';
  pcVar12 = "";
  if (pcVar14 != (char *)0x0) {
    pcVar9 = " # ";
    if (type == XFail || type == BlacklistedXFail) {
      pcVar9 = "";
    }
    pcVar11 = "";
    if ((description != (char *)0x0) && (pcVar11 = " ", *description == '\0')) {
      pcVar11 = "";
    }
    QTest::qt_asprintf(&directive,"%s%s%s%s",pcVar9,pcVar14,pcVar11,description);
  }
  if ((type == XFail) || (type == BlacklistedXFail)) {
    if ((this->m_gatherMessages == true) && (*(this->m_firstExpectedFail).buf == '\0')) {
      QTestPrivate::appendCharBuffer(&this->m_firstExpectedFail,&directive);
    }
  }
  else {
    this->m_gatherMessages = false;
    iVar8 = QTestLog::totalCount();
    outputTestLine(this,(bool)(bVar15 & 1),iVar8,&directive);
  }
  flushComments(this);
  if (((bVar15 & 1) != 0) && (*(this->m_messages).buf == '\0')) goto LAB_001239ad;
  if ((type == BlacklistedXFail) || (type == XFail)) {
    memset(&message,0xaa,0x210);
    message._size = 0x200;
    message.buf = message.staticBuf;
    message.staticBuf._0_8_ = message.staticBuf._0_8_ & 0xffffffffffffff00;
    pcVar9 = "  # xfail:%s\n";
    if (this->m_gatherMessages != false) {
      pcVar9 = "    - severity: xfail\n      message:%s\n";
    }
    QTest::qt_asprintf(&message,pcVar9,directive.buf + 4);
    outputBuffer(this,&message);
    QTestCharBuffer::~QTestCharBuffer(&message);
  }
  else {
    beginYamlish(this);
  }
  if ((type == BlacklistedXFail) || (type == XFail)) {
    if (this->m_gatherMessages == true) {
      local_5c8 = "      ";
      goto LAB_00122e33;
    }
  }
  else {
    local_5c8 = "  ";
LAB_00122e33:
    if ((bVar15 & 1) == 0) {
      if ((addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::verifyRegex
           == '\0') &&
         (iVar8 = __cxa_guard_acquire(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                                       ::verifyRegex), iVar8 != 0)) {
        Qt::Literals::StringLiterals::operator____s
                  ((QString *)&message,
                   L"^\'(?<actualexpression>.*)\' returned (?<actual>\\w+)\\. \\((?<message>.*)\\)$"
                   ,0x48);
        QRegularExpression::QRegularExpression
                  ((QRegularExpression *)
                   &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                    verifyRegex,&message,0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&message);
        __cxa_atexit(QRegularExpression::~QRegularExpression,
                     &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                      verifyRegex,&__dso_handle);
        __cxa_guard_release(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                             ::verifyRegex);
      }
      if ((addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::compareRegex
           == '\0') &&
         (iVar8 = __cxa_guard_acquire(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                                       ::compareRegex), iVar8 != 0)) {
        Qt::Literals::StringLiterals::operator____s
                  ((QString *)&message,
                   L"^(?<message>.*)\n\\s*Actual\\s+\\((?<actualexpression>.*)\\)\\s*: (?<actual>.*)\n\\s*Expected\\s+\\((?<expectedexpresssion>.*)\\)\\s*: (?<expected>.*)$"
                   ,0x8b);
        QRegularExpression::QRegularExpression
                  ((QRegularExpression *)
                   &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                    compareRegex,&message,0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&message);
        __cxa_atexit(QRegularExpression::~QRegularExpression,
                     &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                      compareRegex,&__dso_handle);
        __cxa_guard_release(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                             ::compareRegex);
      }
      if ((addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
           compareOpRegex == '\0') &&
         (iVar8 = __cxa_guard_acquire(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                                       ::compareOpRegex), iVar8 != 0)) {
        Qt::Literals::StringLiterals::operator____s
                  ((QString *)&message,
                   L"^(?<message>.*)\n\\s*Computed\\s+\\((?<actualexpression>.*)\\)\\s*: (?<actual>.*)\n\\s*Baseline\\s+\\((?<expectedexpresssion>.*)\\)\\s*: (?<expected>.*)$"
                   ,0x8d);
        QRegularExpression::QRegularExpression
                  ((QRegularExpression *)
                   &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                    compareOpRegex,&message,0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&message);
        __cxa_atexit(QRegularExpression::~QRegularExpression,
                     &addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)::
                      compareOpRegex,&__dso_handle);
        __cxa_guard_release(&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                             ::compareOpRegex);
      }
      local_478.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_478.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_478.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QByteArrayView::QByteArrayView<const_char_*,_true>(&local_488,&description_local);
      QVar17.m_data = (storage_type *)local_488.m_size;
      QVar17.m_size = (qsizetype)&local_478;
      QString::fromUtf8(QVar17);
      _match = &DAT_aaaaaaaaaaaaaaaa;
      QRegularExpression::match
                (&match,&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                         ::verifyRegex,&local_478,0,0,0);
      cVar6 = QRegularExpressionMatch::hasMatch();
      if (cVar6 == '\0') {
        QRegularExpression::match
                  (&message,&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                             ::compareRegex,&local_478,0,0,0);
        puVar5 = _match;
        _match = (undefined1 *)message._0_8_;
        message._0_8_ = puVar5;
        QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&message);
        cVar6 = QRegularExpressionMatch::hasMatch();
        if (cVar6 != '\0') {
          iVar8 = 1;
          goto LAB_00122f9c;
        }
        QRegularExpression::match
                  (&message,&addIncident(QAbstractTestLogger::IncidentTypes,char_const*,char_const*,int)
                             ::compareOpRegex,&local_478,0,0,0);
        puVar5 = _match;
        _match = (undefined1 *)message._0_8_;
        message._0_8_ = puVar5;
        QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&message);
        cVar6 = QRegularExpressionMatch::hasMatch();
        pcVar9 = description_local;
        if (cVar6 != '\0') {
          iVar8 = 3;
          goto LAB_00122f9c;
        }
        if (description_local != (char *)0x0 && pcVar14 == (char *)0x0) {
          memset(&message,0xaa,0x210);
          message._size = 0x200;
          message.buf = message.staticBuf;
          message.staticBuf._0_8_ = message.staticBuf._0_8_ & 0xffffffffffffff00;
          QTest::qt_asprintf(&message,"  # %s\n",pcVar9);
          outputBuffer(this,&message);
          QTestCharBuffer::~QTestCharBuffer(&message);
        }
      }
      else {
        iVar8 = 2;
LAB_00122f9c:
        local_4a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_4a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_4a8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QVar18.m_size = (size_t)&match;
        QVar18.field_0.m_data = &local_4a8;
        QRegularExpressionMatch::captured(QVar18);
        local_4c8.d = (Data *)0x0;
        local_4c8.ptr = (char16_t *)0x0;
        local_4c8.size = 0;
        local_4e8.d = (Data *)0x0;
        local_4e8.ptr = (char16_t *)0x0;
        local_4e8.size = 0;
        local_508.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_508.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_508.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        key.m_data = "actualexpression";
        key.m_size = 0x10;
        local_4f0.match = &match;
        addIncident::anon_class_8_1_a847c8e5::operator()((QString *)&local_508,&local_4f0,key);
        message.staticBuf._8_8_ = &local_508;
        if (iVar8 == 1) {
          QVar20.m_size = (size_t)&match;
          QVar20.field_0.m_data = local_528;
          QRegularExpressionMatch::captured(QVar20);
          key_00.m_data = "expectedexpresssion";
          key_00.m_size = 0x13;
          addIncident::anon_class_8_1_a847c8e5::operator()((QString *)&local_548,&local_4f0,key_00);
          QStringBuilder<QString,_QString>::QStringBuilder
                    ((QStringBuilder<QString,_QString> *)&message,(QString *)local_528,
                     (QString *)&local_548);
          QStringBuilder<QString,_QString>::convertTo<QString>
                    ((QString *)&local_578,(QStringBuilder<QString,_QString> *)&message);
          qVar3 = local_4c8.size;
          pcVar13 = local_4c8.ptr;
          pDVar2 = local_4c8.d;
          local_4c8.d = (Data *)local_578.a.m_size;
          local_4c8.ptr = (char16_t *)local_578.a.m_data;
          local_578.a.m_size = (qsizetype)pDVar2;
          local_578.a.m_data = (char *)pcVar13;
          local_4c8.size = (qsizetype)local_578.b.d.d;
          local_578.b.d.d = (Data *)qVar3;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_578)
          ;
          QStringBuilder<QString,_QString>::~QStringBuilder
                    ((QStringBuilder<QString,_QString> *)&message);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_548);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_528);
          QVar21.m_size = (size_t)&match;
          QVar21.field_0.m_data = local_528;
          QRegularExpressionMatch::captured(QVar21);
          message.staticBuf._0_8_ = local_518;
          message.buf = (char *)local_528._8_8_;
          message._0_8_ = local_528._0_8_;
          local_528._0_8_ = (Data *)0x0;
          local_528._8_8_ = (char16_t *)0x0;
          local_518 = (QArrayDataPointer<char16_t> *)0x0;
          QStringBuilder<QString,_const_QString_&>::convertTo<QString>
                    ((QString *)&local_578,(QStringBuilder<QString,_const_QString_&> *)&message);
          qVar3 = local_4e8.size;
          pcVar13 = local_4e8.ptr;
          pDVar2 = local_4e8.d;
          local_4e8.d = (Data *)local_578.a.m_size;
          local_4e8.ptr = (char16_t *)local_578.a.m_data;
          local_578.a.m_size = (qsizetype)pDVar2;
          local_578.a.m_data = (char *)pcVar13;
          local_4e8.size = (qsizetype)local_578.b.d.d;
          local_578.b.d.d = (Data *)qVar3;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_578)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&message);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_528);
          pcVar14 = "QCOMPARE";
        }
        else {
          if (iVar8 == 2) {
            QVar19.m_size = (size_t)&match;
            QVar19.field_0.m_data = &local_548;
            QRegularExpressionMatch::captured(QVar19);
            QString::toLower_helper((QString *)local_528);
            message.staticBuf._0_8_ = local_518;
            message.buf = (char *)local_528._8_8_;
            message._0_8_ = local_528._0_8_;
            local_528._0_8_ = (Data *)0x0;
            local_528._8_8_ = (char16_t *)0x0;
            local_518 = (QArrayDataPointer<char16_t> *)0x0;
            QStringBuilder<QString,_const_QString_&>::convertTo<QString>
                      ((QString *)&local_578,(QStringBuilder<QString,_const_QString_&> *)&message);
            qVar3 = local_4e8.size;
            pcVar13 = local_4e8.ptr;
            pDVar2 = local_4e8.d;
            local_4e8.d = (Data *)local_578.a.m_size;
            local_4e8.ptr = (char16_t *)local_578.a.m_data;
            local_578.a.m_size = (qsizetype)pDVar2;
            local_578.a.m_data = (char *)pcVar13;
            local_4e8.size = (qsizetype)local_578.b.d.d;
            local_578.b.d.d = (Data *)qVar3;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_578);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&message)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_528);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_548);
            bVar15 = QString::startsWith((QLatin1String *)&local_4e8,5);
            local_578.a.m_size = (ulong)bVar15 + 4;
            local_578.a.m_data = "true";
            if (bVar15 != 0) {
              local_578.a.m_data = "false";
            }
            local_578.b.d.d = (Data *)&local_508;
            QStringBuilder<QLatin1String,_const_QString_&>::convertTo<QString>
                      ((QString *)&message,
                       (QStringBuilder<QLatin1String,_const_QString_&> *)&local_578);
            qVar3 = local_4c8.size;
            pcVar13 = local_4c8.ptr;
            pDVar2 = local_4c8.d;
            local_4c8.d = (Data *)message._0_8_;
            local_4c8.ptr = (char16_t *)message.buf;
            message._0_8_ = pDVar2;
            message.buf = (char *)pcVar13;
            local_4c8.size._0_1_ = message.staticBuf[0];
            local_4c8.size._1_1_ = message.staticBuf[1];
            local_4c8.size._2_1_ = message.staticBuf[2];
            local_4c8.size._3_1_ = message.staticBuf[3];
            local_4c8.size._4_1_ = message.staticBuf[4];
            local_4c8.size._5_1_ = message.staticBuf[5];
            local_4c8.size._6_1_ = message.staticBuf[6];
            local_4c8.size._7_1_ = message.staticBuf[7];
            qVar4 = local_4c8.size;
            local_4c8.size._0_1_ = (undefined1)qVar3;
            local_4c8.size._1_1_ = SUB81(qVar3,1);
            local_4c8.size._2_1_ = SUB81(qVar3,2);
            local_4c8.size._3_1_ = SUB81(qVar3,3);
            local_4c8.size._4_1_ = SUB81(qVar3,4);
            local_4c8.size._5_1_ = SUB81(qVar3,5);
            local_4c8.size._6_1_ = SUB81(qVar3,6);
            local_4c8.size._7_1_ = SUB81(qVar3,7);
            message.staticBuf[0] = (undefined1)local_4c8.size;
            message.staticBuf[1] = local_4c8.size._1_1_;
            message.staticBuf[2] = local_4c8.size._2_1_;
            message.staticBuf[3] = local_4c8.size._3_1_;
            message.staticBuf[4] = local_4c8.size._4_1_;
            message.staticBuf[5] = local_4c8.size._5_1_;
            message.staticBuf[6] = local_4c8.size._6_1_;
            message.staticBuf[7] = local_4c8.size._7_1_;
            local_4c8.size = qVar4;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&message)
            ;
            pcVar14 = "QVERIFY";
            if ((undefined1 *)local_4a8.size != (undefined1 *)0x0) goto LAB_00123737;
            this_00 = &message;
            Qt::Literals::StringLiterals::operator____s
                      ((QString *)this_00,L"Verification failed",0x13);
            qVar3 = local_4a8.size;
            pcVar13 = local_4a8.ptr;
            pDVar2 = local_4a8.d;
            local_4a8.d = (Data *)message._0_8_;
            local_4a8.ptr = (char16_t *)message.buf;
            message._0_8_ = pDVar2;
            message.buf = (char *)pcVar13;
            local_4a8.size._0_1_ = message.staticBuf[0];
            local_4a8.size._1_1_ = message.staticBuf[1];
            local_4a8.size._2_1_ = message.staticBuf[2];
            local_4a8.size._3_1_ = message.staticBuf[3];
            local_4a8.size._4_1_ = message.staticBuf[4];
            local_4a8.size._5_1_ = message.staticBuf[5];
            local_4a8.size._6_1_ = message.staticBuf[6];
            local_4a8.size._7_1_ = message.staticBuf[7];
            qVar4 = local_4a8.size;
            local_4a8.size._0_1_ = (undefined1)qVar3;
            local_4a8.size._1_1_ = SUB81(qVar3,1);
            local_4a8.size._2_1_ = SUB81(qVar3,2);
            local_4a8.size._3_1_ = SUB81(qVar3,3);
            local_4a8.size._4_1_ = SUB81(qVar3,4);
            local_4a8.size._5_1_ = SUB81(qVar3,5);
            local_4a8.size._6_1_ = SUB81(qVar3,6);
            local_4a8.size._7_1_ = SUB81(qVar3,7);
            message.staticBuf[0] = (undefined1)local_4a8.size;
            message.staticBuf[1] = local_4a8.size._1_1_;
            message.staticBuf[2] = local_4a8.size._2_1_;
            message.staticBuf[3] = local_4a8.size._3_1_;
            message.staticBuf[4] = local_4a8.size._4_1_;
            message.staticBuf[5] = local_4a8.size._5_1_;
            message.staticBuf[6] = local_4a8.size._6_1_;
            message.staticBuf[7] = local_4a8.size._7_1_;
            local_4a8.size = qVar4;
          }
          else {
            s.m_data = "different";
            s.m_size = 9;
            bVar7 = QString::contains((QString *)&local_4a8,s,CaseSensitive);
            if (bVar7) {
              pcVar12 = "!= ";
              pcVar14 = "QCOMPARE_NE";
            }
            else {
              s_00.m_data = "less than or equal to";
              s_00.m_size = 0x15;
              bVar7 = QString::contains((QString *)&local_4a8,s_00,CaseSensitive);
              if (bVar7) {
                pcVar12 = "<= ";
                pcVar14 = "QCOMPARE_LE";
              }
              else {
                s_01.m_data = "greater than or equal to";
                s_01.m_size = 0x18;
                bVar7 = QString::contains((QString *)&local_4a8,s_01,CaseSensitive);
                if (bVar7) {
                  pcVar12 = ">= ";
                  pcVar14 = "QCOMPARE_GE";
                }
                else {
                  s_02.m_data = "less than";
                  s_02.m_size = 9;
                  bVar7 = QString::contains((QString *)&local_4a8,s_02,CaseSensitive);
                  if (bVar7) {
                    pcVar12 = "< ";
                    pcVar14 = "QCOMPARE_LT";
                  }
                  else {
                    s_03.m_data = "greater than";
                    s_03.m_size = 0xc;
                    bVar7 = QString::contains((QString *)&local_4a8,s_03,CaseSensitive);
                    if (bVar7) {
                      pcVar12 = "> ";
                      pcVar14 = "QCOMPARE_GT";
                    }
                    else {
                      s_04.m_data = "to be equal to";
                      s_04.m_size = 0xe;
                      bVar7 = QString::contains((QString *)&local_4a8,s_04,CaseSensitive);
                      pcVar14 = "Unknown";
                      if (bVar7) {
                        pcVar14 = "QCOMPARE_EQ";
                        pcVar12 = "== ";
                      }
                    }
                  }
                }
              }
            }
            QLatin1String::QLatin1String((QLatin1String *)&message,pcVar14);
            pcVar14 = message.buf;
            QLatin1String::QLatin1String((QLatin1String *)&local_5a8,pcVar12);
            QVar22.m_size = (size_t)&match;
            QVar22.field_0.m_data = &local_548;
            QRegularExpressionMatch::captured(QVar22);
            local_578.b.d.size = local_548.size;
            local_578.b.d.ptr = local_548.ptr;
            local_578.b.d.d = local_548.d;
            local_578.a.m_size = (qsizetype)local_5a8.d;
            local_578.a.m_data = local_5a8.ptr;
            local_548.d = (Data *)0x0;
            local_548.ptr = (char16_t *)0x0;
            local_548.size = 0;
            key_01.m_data = "expectedexpresssion";
            key_01.m_size = 0x13;
            addIncident::anon_class_8_1_a847c8e5::operator()
                      ((QString *)&local_590,&local_4f0,key_01);
            QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QString>::QStringBuilder
                      ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QString> *)&message,
                       &local_578,(QString *)&local_590);
            QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QString>::convertTo<QString>
                      ((QString *)local_528,
                       (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QString> *)&message);
            qVar3 = local_4c8.size;
            pcVar13 = local_4c8.ptr;
            pDVar2 = local_4c8.d;
            local_4c8.d = (Data *)local_528._0_8_;
            local_4c8.ptr = (char16_t *)local_528._8_8_;
            local_528._0_8_ = pDVar2;
            local_528._8_8_ = pcVar13;
            local_4c8.size = (qsizetype)local_518;
            local_518 = (QArrayDataPointer<char16_t> *)qVar3;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_528);
            QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QString>::~QStringBuilder
                      ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QString> *)&message);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_590);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_578.b.d);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_548);
            QVar23.m_size = (size_t)&match;
            QVar23.field_0.m_data = local_528;
            QRegularExpressionMatch::captured(QVar23);
            message.staticBuf._0_8_ = local_518;
            message.buf = (char *)local_528._8_8_;
            message._0_8_ = local_528._0_8_;
            local_528._0_8_ = (Data *)0x0;
            local_528._8_8_ = (char16_t *)0x0;
            local_518 = (QArrayDataPointer<char16_t> *)0x0;
            QStringBuilder<QString,_const_QString_&>::convertTo<QString>
                      ((QString *)&local_578,(QStringBuilder<QString,_const_QString_&> *)&message);
            qVar3 = local_4e8.size;
            pcVar13 = local_4e8.ptr;
            pDVar2 = local_4e8.d;
            local_4e8.d = (Data *)local_578.a.m_size;
            local_4e8.ptr = (char16_t *)local_578.a.m_data;
            local_578.a.m_size = (qsizetype)pDVar2;
            local_578.a.m_data = (char *)pcVar13;
            local_4e8.size = (qsizetype)local_578.b.d.d;
            local_578.b.d.d = (Data *)qVar3;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_578);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&message)
            ;
            this_00 = (QTestCharBuffer *)local_528;
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
        }
LAB_00123737:
        memset(&message,0xaa,0x210);
        message._size = 0x200;
        message.buf = message.staticBuf;
        message.staticBuf._0_8_ = message.staticBuf._0_8_ & 0xffffffffffffff00;
        QString::toLocal8Bit((QByteArray *)&local_578,(QString *)&local_4a8);
        pcVar13 = (char16_t *)local_578.a.m_data;
        if ((char16_t *)local_578.a.m_data == (char16_t *)0x0) {
          pcVar13 = (char16_t *)&QByteArray::_empty;
        }
        QString::toLocal8Bit((QByteArray *)local_528,(QString *)&local_4c8);
        pcVar16 = (char16_t *)local_528._8_8_;
        if ((char16_t *)local_528._8_8_ == (char16_t *)0x0) {
          pcVar16 = (char16_t *)&QByteArray::_empty;
        }
        QString::toLocal8Bit((QByteArray *)&local_548,(QString *)&local_4e8);
        pcVar10 = local_548.ptr;
        if (local_548.ptr == (char16_t *)0x0) {
          pcVar10 = (char16_t *)&QByteArray::_empty;
        }
        QString::toLocal8Bit((QByteArray *)&local_590,(QString *)&local_4c8);
        QString::toLocal8Bit((QByteArray *)&local_5a8,(QString *)&local_4e8);
        if (local_590.ptr == (char16_t *)0x0) {
          local_590.ptr = (char16_t *)&QByteArray::_empty;
        }
        if ((char16_t *)local_5a8.ptr == (char16_t *)0x0) {
          local_5a8.ptr = (char *)&QByteArray::_empty;
        }
        QTest::qt_asprintf(&message,
                           "%stype: %s\n%smessage: %s\n%swanted: %s\n%sfound: %s\n%sexpected: %s\n%sactual: %s\n"
                           ,local_5c8,pcVar14,local_5c8,pcVar13,local_5c8,pcVar16,local_5c8,pcVar10,
                           local_5c8,local_590.ptr,local_5c8,local_5a8.ptr);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_5a8);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_590);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_548);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_528);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_578);
        outputBuffer(this,&message);
        QTestCharBuffer::~QTestCharBuffer(&message);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_508);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4a8);
      }
      QRegularExpressionMatch::~QRegularExpressionMatch(&match);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_478);
    }
    if (file != (char *)0x0) {
      memset(&message,0xaa,0x210);
      message._size = 0x200;
      message.buf = message.staticBuf;
      message.staticBuf._0_8_ = message.staticBuf._0_8_ & 0xffffffffffffff00;
      pcVar12 = QTestResult::currentTestObjectName();
      pcVar14 = QTestResult::currentTestFunction();
      QTest::qt_asprintf(&message,"%sat: %s::%s() (%s:%d)\n%sfile: %s\n%sline: %d\n",local_5c8,
                         pcVar12,pcVar14,file,CONCAT44(in_register_00000084,line),local_5c8,file,
                         local_5c8,CONCAT44(in_register_00000084,line));
      outputBuffer(this,&message);
      QTestCharBuffer::~QTestCharBuffer(&message);
    }
  }
  if ((type != XFail) && (type != BlacklistedXFail)) {
    endYamlish(this);
  }
LAB_001239ad:
  QTestCharBuffer::~QTestCharBuffer(&directive);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTapTestLogger::addIncident(IncidentTypes type, const char *description,
                                 const char *file, int line)
{
    const bool isExpectedFail = type == XFail || type == BlacklistedXFail;
    const bool ok = (m_firstExpectedFail.isEmpty()
                     && (type == Pass || type == BlacklistedPass || type == Skip
                         || type == XPass || type == BlacklistedXPass));

    const char *const incident = [type](const char *priorXFail) {
        switch (type) {
        // We treat expected or blacklisted failures/passes as TODO-failures/passes,
        // which should be treated as soft issues by consumers. Not all do though :/
        case BlacklistedPass:
            if (priorXFail[0] != '\0')
                return priorXFail;
            Q_FALLTHROUGH();
        case XFail: case BlacklistedXFail:
        case XPass: case BlacklistedXPass:
        case BlacklistedFail:
            return "TODO";
        case Skip:
            return "SKIP";
        case Pass:
            if (priorXFail[0] != '\0')
                return priorXFail;
            Q_FALLTHROUGH();
        case Fail:
            break;
        }
        return static_cast<const char *>(nullptr);
    }(m_firstExpectedFail.constData());

    QTestCharBuffer directive;
    if (incident) {
        QTest::qt_asprintf(&directive, "%s%s%s%s",
                           isExpectedFail ? "" : " # ", incident,
                           description && description[0] ? " " : "", description);
    }

    if (!isExpectedFail) {
        m_gatherMessages = false;
        outputTestLine(ok, QTestLog::totalCount(), directive);
    } else if (m_gatherMessages && m_firstExpectedFail.isEmpty()) {
        QTestPrivate::appendCharBuffer(&m_firstExpectedFail, directive);
    }
    flushComments();

    if (!ok || !m_messages.isEmpty()) {
        // All failures need a diagnostics section to not confuse consumers.
        // We also need a diagnostics section when we have messages to report.
        if (isExpectedFail) {
            QTestCharBuffer message;
            if (m_gatherMessages) {
                QTest::qt_asprintf(&message, YAML_INDENT YAML_INDENT "- severity: xfail\n"
                                   YAML_INDENT YAML_INDENT YAML_INDENT "message:%s\n",
                                   directive.constData() + 4);
            } else {
                QTest::qt_asprintf(&message, YAML_INDENT "# xfail:%s\n", directive.constData() + 4);
            }
            outputBuffer(message);
        } else {
            beginYamlish();
        }

        if (!isExpectedFail || m_gatherMessages) {
            const char *indent = isExpectedFail ? YAML_INDENT YAML_INDENT YAML_INDENT : YAML_INDENT;
            if (!ok) {
#if QT_CONFIG(regularexpression)
                enum class OperationType {
                    Unknown,
                    Compare,    /* Plain old QCOMPARE */
                    Verify,     /* QVERIFY */
                    CompareOp,  /* QCOMPARE_OP */
                };

                // This is fragile, but unfortunately testlib doesn't plumb
                // the expected and actual values to the loggers (yet).
                static const QRegularExpression verifyRegex(
                            u"^'(?<actualexpression>.*)' returned "
                            "(?<actual>\\w+)\\. \\((?<message>.*)\\)$"_s);

                static const QRegularExpression compareRegex(
                            u"^(?<message>.*)\n"
                            "\\s*Actual\\s+\\((?<actualexpression>.*)\\)\\s*: (?<actual>.*)\n"
                            "\\s*Expected\\s+\\((?<expectedexpresssion>.*)\\)\\s*: "
                            "(?<expected>.*)$"_s);

                static const QRegularExpression compareOpRegex(
                            u"^(?<message>.*)\n"
                            "\\s*Computed\\s+\\((?<actualexpression>.*)\\)\\s*: (?<actual>.*)\n"
                            "\\s*Baseline\\s+\\((?<expectedexpresssion>.*)\\)\\s*: "
                            "(?<expected>.*)$"_s);

                const QString descriptionString = QString::fromUtf8(description);
                QRegularExpressionMatch match = verifyRegex.match(descriptionString);

                OperationType opType = OperationType::Unknown;
                if (match.hasMatch())
                    opType = OperationType::Verify;

                if (opType == OperationType::Unknown) {
                    match = compareRegex.match(descriptionString);
                    if (match.hasMatch())
                        opType = OperationType::Compare;
                }

                if (opType == OperationType::Unknown) {
                    match = compareOpRegex.match(descriptionString);
                    if (match.hasMatch())
                        opType = OperationType::CompareOp;
                }

                if (opType != OperationType::Unknown) {
                    QString message = match.captured(u"message");
                    QLatin1StringView comparisonType;
                    QString expected;
                    QString actual;
                    const auto parenthesize = [&match](QLatin1StringView key) -> QString {
                        return " ("_L1 % match.captured(key) % u')';
                    };
                    const QString actualExpression = parenthesize("actualexpression"_L1);

                    if (opType == OperationType::Verify) {
                        comparisonType = "QVERIFY"_L1;
                        actual = match.captured(u"actual").toLower() % actualExpression;
                        expected = (actual.startsWith("true "_L1) ? "false"_L1 : "true"_L1)
                                % actualExpression;
                        if (message.isEmpty())
                            message = u"Verification failed"_s;
                    } else if (opType == OperationType::Compare) {
                        comparisonType = "QCOMPARE"_L1;
                        expected = match.captured(u"expected")
                            % parenthesize("expectedexpresssion"_L1);
                        actual = match.captured(u"actual") % actualExpression;
                    } else {
                        struct ComparisonInfo {
                            const char *comparisonType;
                            const char *comparisonStringOp;
                        };
                        // get a proper comparison type based on the error message
                        const auto info = [](const QString &err) -> ComparisonInfo {
                            if (err.contains("different"_L1))
                                return { "QCOMPARE_NE", "!= " };
                            else if (err.contains("less than or equal to"_L1))
                                return { "QCOMPARE_LE", "<= " };
                            else if (err.contains("greater than or equal to"_L1))
                                return { "QCOMPARE_GE", ">= " };
                            else if (err.contains("less than"_L1))
                                return { "QCOMPARE_LT", "< " };
                            else if (err.contains("greater than"_L1))
                                return { "QCOMPARE_GT", "> " };
                            else if (err.contains("to be equal to"_L1))
                                return { "QCOMPARE_EQ", "== " };
                            else
                                return { "Unknown", "" };
                        }(message);
                        comparisonType = QLatin1StringView(info.comparisonType);
                        expected = QLatin1StringView(info.comparisonStringOp)
                                    % match.captured(u"expected")
                                    % parenthesize("expectedexpresssion"_L1);
                        actual = match.captured(u"actual") % actualExpression;
                    }

                    QTestCharBuffer diagnosticsYamlish;
                    QTest::qt_asprintf(&diagnosticsYamlish,
                                       "%stype: %s\n"
                                       "%smessage: %s\n"
                                       // Some consumers understand 'wanted/found', others need
                                       // 'expected/actual', so be compatible with both.
                                       "%swanted: %s\n"
                                       "%sfound: %s\n"
                                       "%sexpected: %s\n"
                                       "%sactual: %s\n",
                                       indent, comparisonType.latin1(),
                                       indent, qPrintable(message),
                                       indent, qPrintable(expected), indent, qPrintable(actual),
                                       indent, qPrintable(expected), indent, qPrintable(actual)
                    );

                    outputBuffer(diagnosticsYamlish);
                } else
#endif
                if (description && !incident) {
                    QTestCharBuffer unparsableDescription;
                    QTest::qt_asprintf(&unparsableDescription, YAML_INDENT "# %s\n", description);
                    outputBuffer(unparsableDescription);
                }
            }

            if (file) {
                QTestCharBuffer location;
                QTest::qt_asprintf(&location,
                                   // The generic 'at' key is understood by most consumers.
                                   "%sat: %s::%s() (%s:%d)\n"

                                   // The file and line keys are for consumers that are able
                                   // to read more granular location info.
                                   "%sfile: %s\n"
                                   "%sline: %d\n",

                                   indent, QTestResult::currentTestObjectName(),
                                   QTestResult::currentTestFunction(),
                                   file, line, indent, file, indent, line
                    );
                outputBuffer(location);
            }
        }

        if (!isExpectedFail)
            endYamlish();
    }
}